

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int gctm(lua_State *L)

{
  int n;
  
  for (n = luaL_len(L,1); 0 < n; n = n + -1) {
    lua_rawgeti(L,1,n);
    lua_touserdata(L,-1);
    lua_settop(L,-2);
  }
  return 0;
}

Assistant:

static int gctm (lua_State *L) {
  int n = luaL_len(L, 1);
  for (; n >= 1; n--) {  /* for each handle, in reverse order */
    lua_rawgeti(L, 1, n);  /* get handle CLIBS[n] */
    ll_unloadlib(lua_touserdata(L, -1));
    lua_pop(L, 1);  /* pop handle */
  }
  return 0;
}